

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O1

bool DNA::contains(Base *dna1,size_t size1,Base *dna2,size_t size2)

{
  Base BVar1;
  Base *matcher;
  Base *pBVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  if (size1 < size2) {
    return false;
  }
  pBVar2 = dna2;
  if (size1 != 0) {
    lVar3 = 0;
    bVar4 = false;
    do {
      if (bVar4) {
        if (pBVar2 == dna2 + size2) {
          return true;
        }
        BVar1 = *pBVar2;
        pBVar2 = pBVar2 + 1;
        if (BVar1 != *(Base *)((long)dna1 + lVar3)) {
          bVar4 = false;
          pBVar2 = dna2;
        }
      }
      else {
        bVar5 = *pBVar2 == *(Base *)((long)dna1 + lVar3);
        if (bVar5) {
          bVar4 = true;
        }
        pBVar2 = pBVar2 + bVar5;
      }
      lVar3 = lVar3 + 4;
    } while (size1 * 4 != lVar3);
  }
  return pBVar2 == dna2 + size2;
}

Assistant:

bool DNA::contains(const DNA::Base* dna1, 
                   size_t size1, 
                   const DNA::Base* dna2, 
                   size_t size2)
{
    bool mode = false;
    const DNA::Base* end1 = dna1 + size1;
    const DNA::Base* end2 = dna2 + size2;
    const DNA::Base* matcher = dna2;
    if (size2 > size1)
        return false;
    while (dna1 != end1) {
        if (mode) {
            if (matcher == end2)
                return true;
            else if (*matcher == *dna1)
                ++matcher;
            else {
                matcher = dna2;
                mode = false;
            }
        } else {
            if (*matcher == *dna1) {
                mode = true;
                ++matcher;
            }
        }
        ++dna1;
    }
    // Check once here incase it's at the end
    if (matcher == end2)
        return true;
    return false;
}